

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actorptrselect.cpp
# Opt level: O3

void VerifyMasterChain(AActor *self)

{
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  AActor *pAVar5;
  
  if ((self != (AActor *)0x0) && (pAVar4 = (self->master).field_0.p, pAVar4 != (AActor *)0x0)) {
    paVar1 = &(self->master).field_0;
    pAVar2 = self;
    if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      do {
        pAVar3 = pAVar4;
        pAVar4 = self;
        if (pAVar3 == self) goto LAB_00496d1f;
        while (pAVar4 != pAVar2) {
          pAVar5 = (pAVar4->master).field_0.p;
          if (pAVar5 == (AActor *)0x0) {
LAB_00496cf3:
            pAVar5 = (AActor *)0x0;
          }
          else if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            (pAVar4->master).field_0.p = (AActor *)0x0;
            goto LAB_00496cf3;
          }
          pAVar4 = pAVar5;
          if (pAVar5 == pAVar3) goto LAB_00496d1f;
        }
        pAVar4 = (pAVar3->master).field_0.p;
        if (pAVar4 == (AActor *)0x0) {
          return;
        }
        pAVar2 = pAVar3;
      } while (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0);
      paVar1 = &(pAVar3->master).field_0;
    }
LAB_00496d1f:
    *paVar1 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
  }
  return;
}

Assistant:

void VerifyMasterChain(AActor *self)
{
	// See VerifyTargetChain for detailed comments.

	if (!self) return;
	AActor *origin = self;
	AActor *next = origin->master;
	while (next) // We always care (See "VerifyTargetChain")
	{
		AActor *compare = self;
		for (;;)
		{
			if (compare == next)
			{
				self->master = NULL;
				return;
			}
			if (compare == origin) break;
			compare = compare->master;
		}

		origin = next;
		next = next->master;
	}
}